

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permute.c
# Opt level: O1

void permute(long *a,int c,long s)

{
  long lVar1;
  ulong lower;
  
  if (0 < c && a != (long *)0x0) {
    lower = 0;
    do {
      dss_random(&permute::source,lower,(long)(c + -1),s);
      lVar1 = a[permute::source];
      a[permute::source] = a[lower];
      a[lower] = lVar1;
      lower = lower + 1;
    } while ((uint)c != lower);
  }
  return;
}

Assistant:

void	permute(long *a, int c, long s)
{
    int i;
    static DSS_HUGE source;
    static long temp;
    
	if (a != (long *)NULL)
	{
		for (i=0; i < c; i++)
		{
			RANDOM(source, (long)i, (long)(c - 1), s);
			temp = *(a + source);
			*(a + source) = *(a + i) ;
			*(a + i) = temp;
		}
	}
	
	return;
}